

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::CurrentVertexAttribInitialCase::test
          (CurrentVertexAttribInitialCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *this_01;
  TestContext *this_02;
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  undefined7 extraout_var;
  GLuint index;
  int attribute_count;
  StateQueryMemoryWriteGuard<float[4]> attribValue;
  undefined1 local_1b0 [384];
  
  attribute_count = 0x10;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8869,&attribute_count);
  this_01 = (ostringstream *)(local_1b0 + 8);
  for (index = 0; (int)index < attribute_count; index = index + 1) {
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::StateQueryMemoryWriteGuard
              (&attribValue);
    glu::CallLogWrapper::glGetVertexAttribfv(this_00,index,0x8626,attribValue.m_value);
    bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
                      (&attribValue,
                       (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
    ;
    auVar1._4_4_ = -(uint)(attribValue.m_value[1] != 0.0);
    auVar1._0_4_ = -(uint)(attribValue.m_value[0] != 0.0);
    auVar1._8_4_ = -(uint)(attribValue.m_value[2] != 0.0);
    auVar1._12_4_ = -(uint)(attribValue.m_value[3] != 1.0);
    iVar3 = movmskps((int)CONCAT71(extraout_var,bVar2),auVar1);
    if (iVar3 != 0) {
      local_1b0._0_8_ =
           ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(this_01);
      std::operator<<((ostream *)this_01,"// ERROR: Expected [0, 0, 0, 1];");
      std::operator<<((ostream *)this_01,"got [");
      std::ostream::operator<<(this_01,attribValue.m_value[0]);
      std::operator<<((ostream *)this_01,",");
      std::ostream::operator<<(this_01,attribValue.m_value[1]);
      std::operator<<((ostream *)this_01,",");
      std::ostream::operator<<(this_01,attribValue.m_value[2]);
      std::operator<<((ostream *)this_01,",");
      std::ostream::operator<<(this_01,attribValue.m_value[3]);
      std::operator<<((ostream *)this_01,"]");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_01);
      this_02 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      if (this_02->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(this_02,QP_TEST_RESULT_FAIL,"got invalid attribute value");
      }
    }
  }
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		int attribute_count = 16;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &attribute_count);

		// initial

		for (int index = 0; index < attribute_count; ++index)
		{
			StateQueryMemoryWriteGuard<GLfloat[4]> attribValue;
			glGetVertexAttribfv(index, GL_CURRENT_VERTEX_ATTRIB, attribValue);
			attribValue.verifyValidity(m_testCtx);

			if (attribValue[0] != 0.0f || attribValue[1] != 0.0f || attribValue[2] != 0.0f || attribValue[3] != 1.0f)
			{
				m_testCtx.getLog() << TestLog::Message
					<< "// ERROR: Expected [0, 0, 0, 1];"
					<< "got [" << attribValue[0] << "," << attribValue[1] << "," << attribValue[2] << "," << attribValue[3] << "]"
					<< TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid attribute value");
			}
		}
	}